

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APInt.cpp
# Opt level: O0

double __thiscall llvm::APInt::sqrt(APInt *this,double __x)

{
  bool bVar1;
  uint uVar2;
  APInt *in_RSI;
  double extraout_XMM0_Qa;
  double dVar3;
  double extraout_XMM0_Qa_00;
  double extraout_XMM0_Qa_01;
  undefined1 auVar4 [16];
  uint64_t local_1b8;
  uint64_t local_1a8;
  APInt local_180;
  APInt local_170;
  undefined1 local_160 [8];
  APInt offset;
  APInt local_140;
  undefined1 local_130 [8];
  APInt midpoint;
  APInt local_118;
  APInt local_108;
  APInt local_f8;
  APInt local_e8;
  undefined1 local_d8 [8];
  APInt nextSquare;
  APInt square;
  APInt local_a8;
  APInt local_98;
  APInt local_88;
  APInt local_78;
  undefined1 local_68 [8];
  APInt two;
  APInt x_new;
  APInt x_old;
  APInt testy;
  uint i;
  uint nbits;
  uint magnitude;
  APInt *this_local;
  
  uVar2 = getActiveBits(in_RSI);
  if (uVar2 < 6) {
    uVar2 = in_RSI->BitWidth;
    bVar1 = isSingleWord(in_RSI);
    if (bVar1) {
      local_1a8 = (in_RSI->U).VAL;
    }
    else {
      local_1a8 = *(in_RSI->U).pVal;
    }
    APInt(this,uVar2,(ulong)""[local_1a8],false);
    dVar3 = extraout_XMM0_Qa;
  }
  else if (uVar2 < 0x34) {
    uVar2 = in_RSI->BitWidth;
    bVar1 = isSingleWord(in_RSI);
    if (bVar1) {
      local_1b8 = (in_RSI->U).VAL;
    }
    else {
      local_1b8 = *(in_RSI->U).pVal;
    }
    auVar4._8_4_ = (int)(local_1b8 >> 0x20);
    auVar4._0_8_ = local_1b8;
    auVar4._12_4_ = 0x45300000;
    dVar3 = ::sqrt((auVar4._8_8_ - 1.9342813113834067e+25) +
                   ((double)CONCAT44(0x43300000,(int)local_1b8) - 4503599627370496.0));
    dVar3 = round(dVar3);
    APInt(this,uVar2,(long)dVar3 | (long)(dVar3 - 9.223372036854776e+18) & (long)dVar3 >> 0x3f,false
         );
    dVar3 = extraout_XMM0_Qa_00;
  }
  else {
    uVar2 = in_RSI->BitWidth;
    testy._12_4_ = 4;
    APInt((APInt *)&x_old.BitWidth,in_RSI->BitWidth,0x10,false);
    APInt((APInt *)&x_new.BitWidth,in_RSI->BitWidth,1,false);
    APInt((APInt *)&two.BitWidth,in_RSI->BitWidth,0,false);
    APInt((APInt *)local_68,in_RSI->BitWidth,2,false);
    while (((uint)testy._12_4_ < uVar2 && (bVar1 = ule(in_RSI,(APInt *)&x_old.BitWidth), !bVar1))) {
      testy._12_4_ = testy._12_4_ + 2;
      shl(&local_88,(int)&x_old + 8);
      operator=((APInt *)&x_old.BitWidth,&local_88);
      ~APInt(&local_88);
    }
    shl(&local_78,(int)&x_new + 8);
    operator=((APInt *)&x_new.BitWidth,&local_78);
    ~APInt(&local_78);
    while( true ) {
      udiv((APInt *)&square.BitWidth,in_RSI);
      llvm::operator+((llvm *)&local_a8,(APInt *)&square.BitWidth,(APInt *)&x_new.BitWidth);
      udiv(&local_98,&local_a8);
      operator=((APInt *)&two.BitWidth,&local_98);
      ~APInt(&local_98);
      ~APInt(&local_a8);
      ~APInt((APInt *)&square.BitWidth);
      bVar1 = ule((APInt *)&x_new.BitWidth,(APInt *)&two.BitWidth);
      if (bVar1) break;
      operator=((APInt *)&x_new.BitWidth,(APInt *)&two.BitWidth);
    }
    operator*((APInt *)&nextSquare.BitWidth,(APInt *)&x_new.BitWidth);
    APInt(&local_f8,(APInt *)&x_new.BitWidth);
    llvm::operator+((llvm *)&local_e8,&local_f8,1);
    APInt(&local_118,(APInt *)&x_new.BitWidth);
    llvm::operator+((llvm *)&local_108,&local_118,1);
    operator*((APInt *)local_d8,&local_e8);
    ~APInt(&local_108);
    ~APInt(&local_118);
    ~APInt(&local_e8);
    ~APInt(&local_f8);
    bVar1 = ult(in_RSI,(APInt *)&nextSquare.BitWidth);
    if (bVar1) {
      APInt(this,(APInt *)&x_new.BitWidth);
      midpoint._12_4_ = 1;
    }
    else {
      bVar1 = ule(in_RSI,(APInt *)local_d8);
      if (!bVar1) {
        __assert_fail("this->ule(nextSquare) && \"Error in APInt::sqrt computation\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APInt.cpp"
                      ,0x444,"APInt llvm::APInt::sqrt() const");
      }
      APInt((APInt *)&offset.BitWidth,(APInt *)local_d8);
      llvm::operator-((llvm *)&local_140,(APInt *)&offset.BitWidth,(APInt *)&nextSquare.BitWidth);
      udiv((APInt *)local_130,&local_140);
      ~APInt(&local_140);
      ~APInt((APInt *)&offset.BitWidth);
      APInt(&local_170,in_RSI);
      llvm::operator-((llvm *)local_160,&local_170,(APInt *)&nextSquare.BitWidth);
      ~APInt(&local_170);
      bVar1 = ult((APInt *)local_160,(APInt *)local_130);
      if (bVar1) {
        APInt(this,(APInt *)&x_new.BitWidth);
      }
      else {
        APInt(&local_180,(APInt *)&x_new.BitWidth);
        llvm::operator+((llvm *)this,&local_180,1);
        ~APInt(&local_180);
      }
      midpoint._12_4_ = 1;
      ~APInt((APInt *)local_160);
      ~APInt((APInt *)local_130);
    }
    ~APInt((APInt *)local_d8);
    ~APInt((APInt *)&nextSquare.BitWidth);
    ~APInt((APInt *)local_68);
    ~APInt((APInt *)&two.BitWidth);
    ~APInt((APInt *)&x_new.BitWidth);
    ~APInt((APInt *)&x_old.BitWidth);
    dVar3 = extraout_XMM0_Qa_01;
  }
  return dVar3;
}

Assistant:

APInt APInt::sqrt() const {

  // Determine the magnitude of the value.
  unsigned magnitude = getActiveBits();

  // Use a fast table for some small values. This also gets rid of some
  // rounding errors in libc sqrt for small values.
  if (magnitude <= 5) {
    static const uint8_t results[32] = {
      /*     0 */ 0,
      /*  1- 2 */ 1, 1,
      /*  3- 6 */ 2, 2, 2, 2,
      /*  7-12 */ 3, 3, 3, 3, 3, 3,
      /* 13-20 */ 4, 4, 4, 4, 4, 4, 4, 4,
      /* 21-30 */ 5, 5, 5, 5, 5, 5, 5, 5, 5, 5,
      /*    31 */ 6
    };
    return APInt(BitWidth, results[ (isSingleWord() ? U.VAL : U.pVal[0]) ]);
  }

  // If the magnitude of the value fits in less than 52 bits (the precision of
  // an IEEE double precision floating point value), then we can use the
  // libc sqrt function which will probably use a hardware sqrt computation.
  // This should be faster than the algorithm below.
  if (magnitude < 52) {
    return APInt(BitWidth,
                 uint64_t(::round(::sqrt(double(isSingleWord() ? U.VAL
                                                               : U.pVal[0])))));
  }

  // Okay, all the short cuts are exhausted. We must compute it. The following
  // is a classical Babylonian method for computing the square root. This code
  // was adapted to APInt from a wikipedia article on such computations.
  // See http://www.wikipedia.org/ and go to the page named
  // Calculate_an_integer_square_root.
  unsigned nbits = BitWidth, i = 4;
  APInt testy(BitWidth, 16);
  APInt x_old(BitWidth, 1);
  APInt x_new(BitWidth, 0);
  APInt two(BitWidth, 2);

  // Select a good starting value using binary logarithms.
  for (;; i += 2, testy = testy.shl(2))
    if (i >= nbits || this->ule(testy)) {
      x_old = x_old.shl(i / 2);
      break;
    }

  // Use the Babylonian method to arrive at the integer square root:
  for (;;) {
    x_new = (this->udiv(x_old) + x_old).udiv(two);
    if (x_old.ule(x_new))
      break;
    x_old = x_new;
  }

  // Make sure we return the closest approximation
  // NOTE: The rounding calculation below is correct. It will produce an
  // off-by-one discrepancy with results from pari/gp. That discrepancy has been
  // determined to be a rounding issue with pari/gp as it begins to use a
  // floating point representation after 192 bits. There are no discrepancies
  // between this algorithm and pari/gp for bit widths < 192 bits.
  APInt square(x_old * x_old);
  APInt nextSquare((x_old + 1) * (x_old +1));
  if (this->ult(square))
    return x_old;
  assert(this->ule(nextSquare) && "Error in APInt::sqrt computation");
  APInt midpoint((nextSquare - square).udiv(two));
  APInt offset(*this - square);
  if (offset.ult(midpoint))
    return x_old;
  return x_old + 1;
}